

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O3

FT_Error ps_dimension_end(PS_Dimension dim,FT_UInt end_point,FT_Memory memory)

{
  PS_Mask __dest;
  undefined4 uVar1;
  PS_Mask pPVar2;
  byte *pbVar3;
  byte *pbVar4;
  FT_Byte *pFVar5;
  FT_Byte *pFVar6;
  bool bVar7;
  FT_UInt FVar8;
  FT_UInt FVar9;
  undefined4 uVar10;
  FT_Error FVar11;
  FT_UInt FVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  byte *pbVar18;
  ulong uVar19;
  byte *pbVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  undefined4 uStack_40;
  
  uVar13 = (ulong)(dim->masks).num_masks;
  if (uVar13 != 0) {
    (dim->masks).masks[uVar13 - 1].end_point = end_point;
  }
  uVar22 = (dim->counters).num_masks;
  if (1 < (long)(int)uVar22) {
    uVar21 = (ulong)(uVar22 - 2);
    uVar13 = (long)(int)uVar22;
    do {
      uVar23 = uVar13 - 1;
      pPVar2 = (dim->counters).masks;
      pbVar3 = pPVar2[uVar23].bytes;
      uVar16 = uVar21;
      do {
        pbVar4 = pPVar2[uVar16].bytes;
        uVar14 = pPVar2[uVar16].num_bits;
        if (pPVar2[uVar23].num_bits < pPVar2[uVar16].num_bits) {
          uVar14 = pPVar2[uVar23].num_bits;
        }
        uVar17 = (uint)uVar16;
        pbVar20 = pbVar4;
        pbVar18 = pbVar3;
        if (7 < uVar14) {
          uVar19 = (ulong)(uVar14 - 8 >> 3);
          pbVar18 = pbVar3 + uVar19 + 1;
          pbVar20 = pbVar4 + uVar19 + 1;
          lVar15 = 0;
          do {
            if ((pbVar3[lVar15] & pbVar4[lVar15]) != 0) goto LAB_00213d7c;
            uVar14 = uVar14 - 8;
            lVar15 = lVar15 + 1;
          } while (7 < uVar14);
        }
        if ((uVar14 != 0) && (0xffU >> ((byte)uVar14 & 0x1f) < (uint)(*pbVar20 & *pbVar18))) {
LAB_00213d7c:
          uVar14 = (uint)uVar23;
          uVar19 = uVar23;
          if (uVar14 < uVar17) {
            uVar19 = uVar16;
          }
          if (uVar14 <= uVar17) {
            uVar17 = uVar14;
          }
          uVar14 = (uint)uVar19;
          if ((uVar17 < uVar14) && (uVar14 < uVar22)) {
            __dest = pPVar2 + (uVar19 & 0xffffffff);
            FVar12 = __dest->num_bits;
            if (FVar12 != 0) {
              pPVar2 = pPVar2 + uVar17;
              uVar22 = pPVar2->num_bits;
              if (uVar22 < FVar12) {
                FVar11 = ps_mask_ensure(pPVar2,FVar12,memory);
                if (FVar11 != 0) {
                  return FVar11;
                }
                do {
                  if (uVar22 < pPVar2->num_bits) {
                    pPVar2->bytes[uVar22 >> 3] =
                         pPVar2->bytes[uVar22 >> 3] & (byte)(-0x81 >> ((byte)uVar22 & 7));
                  }
                  uVar22 = uVar22 + 1;
                } while (FVar12 != uVar22);
              }
              if (7 < FVar12 + 7) {
                pFVar5 = pPVar2->bytes;
                pFVar6 = __dest->bytes;
                lVar15 = 0;
                do {
                  pFVar5[lVar15] = pFVar5[lVar15] | pFVar6[lVar15];
                  lVar15 = lVar15 + 1;
                } while (FVar12 + 7 >> 3 != (uint)lVar15);
              }
            }
            __dest->num_bits = 0;
            __dest->end_point = 0;
            FVar12 = (dim->counters).num_masks;
            uVar16 = (ulong)(~uVar14 + FVar12);
            if (0 < (int)(~uVar14 + FVar12)) {
              FVar9 = __dest->end_point;
              uVar10 = *(undefined4 *)&__dest->field_0x14;
              FVar12 = __dest->num_bits;
              FVar8 = __dest->max_bits;
              uStack_40 = (undefined4)((ulong)*(undefined8 *)&__dest->max_bits >> 0x20);
              uVar1 = *(undefined4 *)((long)&__dest->bytes + 4);
              memmove(__dest,__dest + 1,uVar16 * 0x18);
              pPVar2 = __dest + uVar16;
              pPVar2->num_bits = FVar12;
              pPVar2->max_bits = FVar8;
              pPVar2->bytes = (FT_Byte *)CONCAT44(uVar1,uStack_40);
              __dest[uVar16].end_point = FVar9;
              *(undefined4 *)&__dest[uVar16].field_0x14 = uVar10;
              FVar12 = (dim->counters).num_masks;
            }
            uVar22 = FVar12 - 1;
            (dim->counters).num_masks = uVar22;
          }
          break;
        }
        uVar16 = uVar16 - 1;
      } while (0 < (int)uVar17);
      uVar21 = uVar21 - 1;
      bVar7 = 2 < (long)uVar13;
      uVar13 = uVar23;
    } while (bVar7);
  }
  return 0;
}

Assistant:

static FT_Error
  ps_dimension_end( PS_Dimension  dim,
                    FT_UInt       end_point,
                    FT_Memory     memory )
  {
    /* end hint mask table */
    ps_dimension_end_mask( dim, end_point );

    /* merge all counter masks into independent "paths" */
    return ps_mask_table_merge_all( &dim->counters, memory );
  }